

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O0

int writeString(FILE *stream,writeoutvar *wovar,per_transfer *per,CURLcode per_result,_Bool use_json
               )

{
  writeoutid wVar1;
  int iVar2;
  char *local_48;
  long local_38;
  long version;
  char *strinfo;
  _Bool valid;
  _Bool use_json_local;
  per_transfer *ppStack_20;
  CURLcode per_result_local;
  per_transfer *per_local;
  writeoutvar *wovar_local;
  FILE *stream_local;
  
  strinfo._2_1_ = 0;
  version = 0;
  strinfo._3_1_ = use_json;
  strinfo._4_4_ = per_result;
  ppStack_20 = per;
  per_local = (per_transfer *)wovar;
  wovar_local = (writeoutvar *)stream;
  if (wovar->ci == CURLINFO_NONE) {
    wVar1 = wovar->id;
    if (wVar1 == VAR_EFFECTIVE_FILENAME) {
      strinfo._2_1_ = (per->outs).filename != (char *)0x0;
      if ((bool)strinfo._2_1_) {
        version = (long)(per->outs).filename;
      }
    }
    else if (wVar1 == VAR_ERRORMSG) {
      if (per_result != CURLE_OK) {
        if (per->errorbuffer[0] == '\0') {
          local_48 = (char *)curl_easy_strerror(per_result);
        }
        else {
          local_48 = per->errorbuffer;
        }
        version = (long)local_48;
        strinfo._2_1_ = 1;
      }
    }
    else if ((wVar1 == VAR_INPUT_URL) &&
            (strinfo._2_1_ = per->this_url != (char *)0x0, (bool)strinfo._2_1_)) {
      version = (long)per->this_url;
    }
  }
  else if (wovar->ci == CURLINFO_HTTP_VERSION) {
    local_38 = 0;
    iVar2 = curl_easy_getinfo(per->curl,0x20002e,&local_38);
    if (((iVar2 == 0) && (-1 < local_38)) && (local_38 < 5)) {
      version = (long)http_version[local_38];
      strinfo._2_1_ = 1;
    }
  }
  else {
    iVar2 = curl_easy_getinfo(per->curl,wovar->ci,&version);
    if ((iVar2 == 0) && (version != 0)) {
      strinfo._2_1_ = 1;
    }
  }
  if ((strinfo._2_1_ & 1) == 0) {
    if ((strinfo._3_1_ & 1) != 0) {
      curl_mfprintf(wovar_local,"\"%s\":null",per_local->next);
    }
  }
  else if ((strinfo._3_1_ & 1) == 0) {
    fputs((char *)version,(FILE *)wovar_local);
  }
  else {
    curl_mfprintf(wovar_local,"\"%s\":\"",per_local->next);
    jsonWriteString((FILE *)wovar_local,(char *)version);
    fputs("\"",(FILE *)wovar_local);
  }
  return 1;
}

Assistant:

static int writeString(FILE *stream, const struct writeoutvar *wovar,
                       struct per_transfer *per, CURLcode per_result,
                       bool use_json)
{
  bool valid = false;
  const char *strinfo = NULL;

  DEBUGASSERT(wovar->writefunc == writeString);

  if(wovar->ci) {
    if(wovar->ci == CURLINFO_HTTP_VERSION) {
      long version = 0;
      if(!curl_easy_getinfo(per->curl, CURLINFO_HTTP_VERSION, &version) &&
         (version >= 0) &&
         (version < (long)(sizeof(http_version)/sizeof(http_version[0])))) {
        strinfo = http_version[version];
        valid = true;
      }
    }
    else {
      if(!curl_easy_getinfo(per->curl, wovar->ci, &strinfo) && strinfo)
        valid = true;
    }
  }
  else {
    switch(wovar->id) {
    case VAR_ERRORMSG:
      if(per_result) {
        strinfo = per->errorbuffer[0] ? per->errorbuffer :
                  curl_easy_strerror(per_result);
        valid = true;
      }
      break;
    case VAR_EFFECTIVE_FILENAME:
      if(per->outs.filename) {
        strinfo = per->outs.filename;
        valid = true;
      }
      break;
    case VAR_INPUT_URL:
      if(per->this_url) {
        strinfo = per->this_url;
        valid = true;
      }
      break;
    default:
      DEBUGASSERT(0);
      break;
    }
  }

  if(valid) {
    DEBUGASSERT(strinfo);
    if(use_json) {
      fprintf(stream, "\"%s\":\"", wovar->name);
      jsonWriteString(stream, strinfo);
      fputs("\"", stream);
    }
    else
      fputs(strinfo, stream);
  }
  else {
    if(use_json)
      fprintf(stream, "\"%s\":null", wovar->name);
  }

  return 1; /* return 1 if anything was written */
}